

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

_Bool createTree(tree_t *tree,uint numLeaves,uint dataSize)

{
  int iVar1;
  uint uVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint8_t *__ptr;
  bitset_word_t *__ptr_00;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  
  if (numLeaves == 0 || tree == (tree_t *)0x0) {
    return false;
  }
  uVar10 = (uint)(byte)-(char)LZCOUNT(numLeaves - 1);
  iVar8 = 2 << (uVar10 & 0x1f);
  iVar4 = -1 << (uVar10 & 0x1f);
  uVar10 = (numLeaves - 1) + iVar4 + iVar8;
  if (dataSize == 0) {
    __ptr = (uint8_t *)0x0;
  }
  else {
    __ptr = (uint8_t *)calloc((ulong)uVar10,(ulong)dataSize);
  }
  tree->nodes = __ptr;
  uVar9 = uVar10 * 2;
  uVar13 = (ulong)uVar9;
  __ptr_00 = (bitset_word_t *)calloc(uVar13 + 0x3f >> 6,8);
  tree->haveNodeExists = __ptr_00;
  if ((dataSize == 0 || __ptr != (uint8_t *)0x0) && (__ptr_00 != (bitset_word_t *)0x0)) {
    tree->depth = 0x21 - LZCOUNT(numLeaves - 1);
    tree->dataSize = dataSize;
    tree->numNodes = uVar10;
    tree->numLeaves = numLeaves;
    if (numLeaves == 0x10) {
      *__ptr_00 = 0x1555555555555555;
    }
    else {
      uVar2 = (uVar10 - numLeaves) * 2;
      uVar7 = (ulong)uVar2;
      uVar14 = uVar2;
      if ((uVar2 & 0x3e) != 0 && uVar2 < uVar9) {
        uVar14 = (iVar4 + iVar8) * 2 - 2;
        do {
          __ptr_00[uVar7 >> 6] = __ptr_00[uVar7 >> 6] | 1L << ((byte)uVar7 & 0x3e);
          uVar7 = uVar7 + 2;
          uVar14 = uVar14 + 2;
          if (uVar13 <= uVar7) break;
        } while ((uVar7 & 0x3e) != 0);
      }
      uVar11 = uVar9 & 0xffffffc0;
      if (uVar14 < uVar11) {
        uVar5 = uVar14 + 0x40;
        if (uVar14 + 0x40 < uVar11) {
          uVar5 = uVar11;
        }
        memset(__ptr_00 + (uVar14 >> 6),0x55,(ulong)((uVar5 + ~uVar14 >> 6) * 8 + 8));
        uVar14 = uVar14 + 0x40 + (~uVar14 + uVar11 & 0xffffffc0);
      }
      if (uVar14 < uVar9) {
        uVar7 = (ulong)uVar14;
        do {
          __ptr_00[uVar7 >> 6] = __ptr_00[uVar7 >> 6] | 1L << ((byte)uVar7 & 0x3e);
          uVar7 = uVar7 + 2;
        } while (uVar7 < uVar13);
      }
      if (uVar2 != 0) {
        iVar6 = iVar4 * 2 + iVar8 * 2;
        uVar9 = (iVar4 + iVar8) * 4;
        iVar12 = 0;
        do {
          if ((((uint)((iVar4 + iVar8) * 2 + -1 + iVar12) < uVar10) &&
              ((__ptr_00[uVar9 - 2 >> 6] >> (uVar9 - 2 & 0x3e) & 1) != 0)) ||
             (((uint)(iVar6 + iVar12) < uVar10 &&
              ((__ptr_00[uVar9 >> 6] >> (uVar9 & 0x3c) & 1) != 0)))) {
            uVar14 = iVar4 * 2 + -2 + iVar8 * 2 + iVar12;
            __ptr_00[uVar14 >> 6] = __ptr_00[uVar14 >> 6] | 1L << ((byte)uVar14 & 0x3e);
          }
          iVar1 = iVar6 + -2 + iVar12;
          iVar12 = iVar12 + -2;
          uVar9 = uVar9 - 4;
        } while (iVar1 != 2);
      }
      *(byte *)__ptr_00 = (byte)*__ptr_00 | 1;
    }
    _Var3 = true;
  }
  else {
    free(__ptr_00);
    free(__ptr);
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

bool createTree(tree_t* tree, unsigned int numLeaves, unsigned int dataSize) {
  if (!tree || !numLeaves) {
    return false;
  }

  unsigned int depth = ceil_log2(numLeaves) + 1;
  /* Num nodes in complete - number of missing leaves */
  unsigned int num_nodes = ((1 << depth) - 1) - ((1 << (depth - 1)) - numLeaves);

  tree->nodes = dataSize ? calloc(num_nodes, dataSize) : NULL;
  /* Depending on the number of leaves, the tree may not be complete */
  tree->haveNodeExists =
      calloc((2 * num_nodes + sizeof(bitset_word_t) * 8 - 1) / (sizeof(bitset_word_t) * 8),
             sizeof(bitset_word_t));
  if ((dataSize && !tree->nodes) || !tree->haveNodeExists) {
    clearTree(tree);
    return false;
  }

  tree->depth     = depth;
  tree->dataSize  = dataSize;
  tree->numNodes  = num_nodes;
  tree->numLeaves = numLeaves;

  initNodes(tree);
  return true;
}